

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

char * __thiscall cimg_library::CImg<char>::_atXYZC(CImg<char> *this,int x,int y,int z,int c)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar1 = this->_width;
  uVar7 = (ulong)(uVar1 - 1);
  if (x < (int)(uVar1 - 1)) {
    uVar7 = (ulong)(uint)x;
  }
  if (x < 1) {
    uVar7 = 0;
  }
  uVar2 = this->_height - 1;
  uVar3 = (ulong)uVar2;
  if (y < (int)uVar2) {
    uVar3 = (ulong)(uint)y;
  }
  if (y < 1) {
    uVar3 = 0;
  }
  uVar2 = this->_depth - 1;
  uVar5 = (ulong)uVar2;
  if (z < (int)uVar2) {
    uVar5 = (ulong)(uint)z;
  }
  if (z < 1) {
    uVar5 = 0;
  }
  uVar2 = this->_spectrum - 1;
  uVar4 = (ulong)uVar2;
  if (c < (int)uVar2) {
    uVar4 = (ulong)(uint)c;
  }
  if (c < 1) {
    uVar4 = 0;
  }
  lVar6 = (ulong)this->_height * (ulong)uVar1;
  return this->_data + lVar6 * (ulong)this->_depth * uVar4 + uVar5 * lVar6 + uVar7 + uVar3 * uVar1;
}

Assistant:

int width() const {
      return (int)_width;
    }